

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
check_absent_keys<unsigned_long>
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<unsigned_long> absent_keys)

{
  bool bVar1;
  const_iterator puVar2;
  char *message;
  AssertHelper local_90 [3];
  Message local_78;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_70;
  ikey_type<unodb::olc_db<std::uint64_t,_unodb::value_view>_> local_68;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  key_type k;
  unsigned_long absent_key;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<unsigned_long> *__range3;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  initializer_list<unsigned_long> absent_keys_local;
  
  absent_keys_local._M_array = (iterator)absent_keys._M_len;
  this_local = (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)absent_keys._M_array;
  __end0 = std::initializer_list<unsigned_long>::begin
                     ((initializer_list<unsigned_long> *)&this_local);
  puVar2 = std::initializer_list<unsigned_long>::end((initializer_list<unsigned_long> *)&this_local)
  ;
  while( true ) {
    if (__end0 == puVar2) {
      return;
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )coerce_key<unsigned_long>(this,*__end0);
    local_68 = to_ikey(this,(key_type)
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
         ::find(&this->values,&local_68);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
         ::cend(&this->values);
    testing::internal::EqHelper::
    Compare<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_nullptr>
              ((EqHelper *)local_58,"(values.find(to_ikey(k)))","(values.cend())",&local_60,
               &local_70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
      testing::internal::AssertHelper::AssertHelper
                (local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x288,message);
      testing::internal::AssertHelper::operator=(local_90,&local_78);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      testing::Message::~Message(&local_78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
    if (!bVar1) break;
    tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
    try_get<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unsigned_long>
              ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                *)this,(unsigned_long)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    __end0 = __end0 + 1;
  }
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }